

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O2

void __thiscall SRBRoot::compactStringsV2(SRBRoot *this,UHashtable *stringSet,UErrorCode *errorCode)

{
  short sVar1;
  StringResource *this_00;
  SResource *pSVar2;
  long lVar3;
  long lVar4;
  LocalArray<StringResource_*> LVar5;
  UBool UVar6;
  uint uVar7;
  int32_t iVar8;
  int32_t iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  UHashElement *pUVar13;
  StringResource *pSVar14;
  uint uVar15;
  ulong uVar16;
  int32_t i;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  LocalArray<StringResource_*> array;
  int32_t pos;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar7 = uhash_count_63(stringSet);
  lVar11 = (long)(int)uVar7;
  uVar12 = 0xffffffffffffffff;
  if (-1 < (int)uVar7) {
    uVar12 = lVar11 * 8;
  }
  array.super_LocalPointerBase<StringResource_*>.ptr =
       (LocalPointerBase<StringResource_*>)operator_new__(uVar12);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pos = -1;
    uVar17 = 0;
    uVar12 = 0;
    if (0 < (int)uVar7) {
      uVar12 = (ulong)uVar7;
    }
    for (; uVar12 != uVar17; uVar17 = uVar17 + 1) {
      pUVar13 = uhash_nextElement_63(stringSet,&pos);
      *(UHashTok *)((long)array.super_LocalPointerBase<StringResource_*>.ptr + uVar17 * 8) =
           pUVar13->key;
    }
    uprv_sortArray_63((void *)array.super_LocalPointerBase<StringResource_*>.ptr,uVar7,8,
                      compareStringSuffixes,(void *)0x0,'\0',errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar17 = 0;
LAB_0021c43c:
      if ((int)uVar17 < (int)uVar7) {
        uVar17 = (ulong)(int)uVar17;
        pSVar14 = *(StringResource **)
                   ((long)array.super_LocalPointerBase<StringResource_*>.ptr + uVar17 * 8);
        iVar10 = pSVar14->fNumCopies;
        iVar8 = StringResource::get16BitStringsLength(pSVar14);
        pSVar14->fNumUnitsSaved = (iVar10 + -1) * iVar8;
        while (uVar17 = uVar17 + 1, (long)uVar17 < lVar11) {
          this_00 = *(StringResource **)
                     ((long)array.super_LocalPointerBase<StringResource_*>.ptr + uVar17 * 8);
          UVar6 = icu_63::UnicodeString::endsWith
                            (&(pSVar14->super_StringBaseResource).fString,
                             &(this_00->super_StringBaseResource).fString);
          if (UVar6 == '\0') goto LAB_0021c43c;
          sVar1 = (pSVar14->super_StringBaseResource).fString.fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar8 = (pSVar14->super_StringBaseResource).fString.fUnion.fFields.fLength;
          }
          else {
            iVar8 = (int)sVar1 >> 5;
          }
          sVar1 = (this_00->super_StringBaseResource).fString.fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar9 = (this_00->super_StringBaseResource).fString.fUnion.fFields.fLength;
          }
          else {
            iVar9 = (int)sVar1 >> 5;
          }
          if (iVar8 == iVar9) {
            __assert_fail("res->length() != suffixRes->length()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                          ,0x621,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
          }
          if (((this_00->super_StringBaseResource).super_SResource.fWritten == '\0') &&
             (this_00->fNumCharsForLength == '\0')) {
            this_00->fSame = pSVar14;
            sVar1 = (pSVar14->super_StringBaseResource).fString.fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar8 = (pSVar14->super_StringBaseResource).fString.fUnion.fFields.fLength;
            }
            else {
              iVar8 = (int)sVar1 >> 5;
            }
            this_00->fSuffixOffset = iVar8 - iVar9;
            if ((pSVar14->super_StringBaseResource).super_SResource.fWritten != '\0') {
              uVar15 = (iVar8 - iVar9) + (pSVar14->super_StringBaseResource).super_SResource.fRes +
                       (int)pSVar14->fNumCharsForLength;
              (this_00->super_StringBaseResource).super_SResource.fRes = uVar15;
              uVar15 = uVar15 & 0xfffffff;
              if (this->fPoolStringIndexLimit <= (int)uVar15) {
                this->fPoolStringIndexLimit = uVar15 + 1;
              }
              (this_00->super_StringBaseResource).super_SResource.fWritten = '\x01';
            }
            iVar10 = this_00->fNumCopies;
            iVar8 = StringResource::get16BitStringsLength(this_00);
            pSVar14->fNumUnitsSaved = pSVar14->fNumUnitsSaved + iVar8 * iVar10;
          }
        }
        uVar17 = (ulong)uVar7;
        goto LAB_0021c43c;
      }
      uprv_sortArray_63((void *)array.super_LocalPointerBase<StringResource_*>.ptr,uVar7,8,
                        compareStringLengths,(void *)0x0,'\0',errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (this->fIsPoolBundle == '\0') {
          if (this->fUsePoolBundle->fStringIndexLimit < this->fPoolStringIndexLimit) {
            __assert_fail("fPoolStringIndexLimit <= fUsePoolBundle->fStringIndexLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                          ,0x66a,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
          }
          uVar17 = 0;
          while ((uVar16 = uVar12, uVar12 != uVar17 &&
                 (pSVar14 = *(StringResource **)
                             ((long)array.super_LocalPointerBase<StringResource_*>.ptr + uVar17 * 8)
                 , uVar16 = uVar17, pSVar14->fSame == (StringResource *)0x0))) {
            if ((pSVar14->super_StringBaseResource).super_SResource.fWritten == '\0') {
              sVar1 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar10 = (this->f16BitUnits).fUnion.fFields.fLength;
              }
              else {
                iVar10 = (int)sVar1 >> 5;
              }
              if (this->fLocalStringIndexLimit <= iVar10) {
                this->fLocalStringIndexLimit = iVar10 + 1;
              }
              StringResource::writeUTF16v2(pSVar14,this->fPoolStringIndexLimit,&this->f16BitUnits);
            }
            uVar17 = uVar17 + 1;
          }
          if ((undefined1  [56])
              ((undefined1  [56])(this->f16BitUnits).fUnion & (undefined1  [56])0x1) !=
              (undefined1  [56])0x0) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
            goto LAB_0021c767;
          }
          if ((this->fWritePoolBundle != (SRBRoot *)0x0) && (2 < gFormatVersion)) {
            pSVar2 = this->fWritePoolBundle->fRoot;
            uVar17 = 0;
            while ((LVar5.super_LocalPointerBase<StringResource_*>.ptr =
                         array.super_LocalPointerBase<StringResource_*>.ptr, uVar16 = uVar12,
                   uVar12 != uVar17 &&
                   (lVar3 = *(long *)((long)array.super_LocalPointerBase<StringResource_*>.ptr +
                                     uVar17 * 8), uVar16 = uVar17, *(long *)(lVar3 + 0x78) == 0))) {
              if (*(ushort *)(lVar3 + 0x40) < 0x20) {
                __assert_fail("!array[i]->fString.isEmpty()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                              ,0x67f,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
              }
              pSVar14 = (StringResource *)operator_new(0x90);
              StringResource::StringResource
                        (pSVar14,this->fWritePoolBundle,
                         (UnicodeString *)
                         (*(long *)((long)LVar5.super_LocalPointerBase<StringResource_*>.ptr +
                                   uVar17 * 8) + 0x38),errorCode);
              (pSVar14->super_StringBaseResource).super_SResource.fNext =
                   *(SResource **)&pSVar2[1].fType;
              *(StringResource **)&pSVar2[1].fType = pSVar14;
              *(int *)&pSVar2[1]._vptr_SResource = *(int *)&pSVar2[1]._vptr_SResource + 1;
              uVar17 = uVar17 + 1;
            }
          }
          iVar10 = this->fPoolStringIndexLimit;
          iVar19 = this->fLocalStringIndexLimit;
          for (uVar16 = uVar16 & 0xffffffff; (long)uVar16 < lVar11; uVar16 = uVar16 + 1) {
            lVar3 = *(long *)((long)array.super_LocalPointerBase<StringResource_*>.ptr + uVar16 * 8)
            ;
            if (*(char *)(lVar3 + 9) == '\0') {
              if (*(short *)(lVar3 + 0x40) < 0) {
                iVar18 = *(int *)(lVar3 + 0x44);
              }
              else {
                iVar18 = (int)*(short *)(lVar3 + 0x40) >> 5;
              }
              lVar4 = *(long *)(lVar3 + 0x78);
              if (*(short *)(lVar4 + 0x40) < 0) {
                iVar20 = *(int *)(lVar4 + 0x44);
              }
              else {
                iVar20 = (int)*(short *)(lVar4 + 0x40) >> 5;
              }
              if (iVar18 == iVar20) {
                __assert_fail("res->length() != same->length()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                              ,0x690,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
              }
              uVar7 = (int)*(char *)(lVar4 + 0x8c) + *(int *)(lVar4 + 0xc) + *(int *)(lVar3 + 0x80);
              *(uint *)(lVar3 + 0xc) = uVar7;
              iVar18 = (uVar7 & 0xfffffff) - iVar10;
              if (iVar18 < 0) {
                __assert_fail("localStringIndex >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                              ,0x694,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
              }
              if (iVar19 <= iVar18) {
                iVar19 = iVar18 + 1;
                this->fLocalStringIndexLimit = iVar19;
              }
              *(undefined1 *)(lVar3 + 9) = 1;
            }
          }
        }
        else {
          uVar21 = 0;
          uVar15 = 0;
          uVar7 = 0;
          for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
            sVar1 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar10 = (this->f16BitUnits).fUnion.fFields.fLength;
            }
            else {
              iVar10 = (int)sVar1 >> 5;
            }
            pSVar14 = *(StringResource **)
                       ((long)array.super_LocalPointerBase<StringResource_*>.ptr + uVar17 * 8);
            sVar1 = (pSVar14->super_StringBaseResource).fString.fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar8 = (pSVar14->super_StringBaseResource).fString.fUnion.fFields.fLength;
            }
            else {
              iVar8 = (int)sVar1 >> 5;
            }
            if ((pSVar14->fNumUnitsSaved < 10) ||
               (0xfffffff < iVar10 + pSVar14->fNumCharsForLength + iVar8)) {
              uVar21 = uVar21 + pSVar14->fNumUnitsSaved;
              (pSVar14->super_StringBaseResource).super_SResource.fRes = 0;
              (pSVar14->super_StringBaseResource).super_SResource.fWritten = '\x01';
            }
            else {
              StringResource::writeUTF16v2(pSVar14,0,&this->f16BitUnits);
              uVar7 = uVar7 + 1;
              uVar15 = uVar15 + pSVar14->fNumUnitsSaved;
            }
          }
          if ((undefined1  [56])
              ((undefined1  [56])(this->f16BitUnits).fUnion & (undefined1  [56])0x1) !=
              (undefined1  [56])0x0) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
          }
          UVar6 = getShowWarning();
          if (UVar6 != '\0') {
            printf("number of shared strings: %d\n",(ulong)uVar7);
            sVar1 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              uVar7 = (this->f16BitUnits).fUnion.fFields.fLength;
            }
            else {
              uVar7 = (int)sVar1 >> 5;
            }
            printf("16-bit units for strings: %6d = %6d bytes\n",(ulong)uVar7,(ulong)(uVar7 * 2));
            printf("16-bit units saved:       %6d = %6d bytes\n",(ulong)uVar15,(ulong)(uVar15 * 2));
            printf("16-bit units not saved:   %6d = %6d bytes\n",(ulong)uVar21,(ulong)(uVar21 * 2));
          }
        }
        sVar1 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar10 = (this->f16BitUnits).fUnion.fFields.fLength;
        }
        else {
          iVar10 = (int)sVar1 >> 5;
        }
        if (this->f16BitStringsLength + 1 < iVar10) {
          __assert_fail("f16BitUnits.length() <= (f16BitStringsLength + 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                        ,0x69c,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
        }
      }
    }
  }
LAB_0021c767:
  icu_63::LocalArray<StringResource_*>::~LocalArray(&array);
  return;
}

Assistant:

void
TableResource::handlePreWrite(uint32_t *byteOffset) {
    preWriteAllRes(byteOffset);
    if (fTableType == URES_TABLE) {
        /* 16-bit count, 16-bit key offsets, 32-bit values */
        fRes = URES_MAKE_RESOURCE(URES_TABLE, *byteOffset >> 2);
        *byteOffset += 2 + fCount * 6;
    } else {
        /* 32-bit count, key offsets and values */
        fRes = URES_MAKE_RESOURCE(URES_TABLE32, *byteOffset >> 2);
        *byteOffset += 4 + fCount * 8;
    }
}